

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linit.c
# Opt level: O1

void luaL_openlibs(lua_State *L)

{
  lua_CFunction p_Var1;
  lua_CFunction openf;
  luaL_Reg *plVar2;
  
  plVar2 = loadedlibs;
  openf = luaopen_base;
  do {
    p_Var1 = plVar2[1].func;
    luaL_requiref(L,plVar2->name,openf,1);
    lua_settop(L,-2);
    plVar2 = plVar2 + 1;
    openf = p_Var1;
  } while (p_Var1 != (lua_CFunction)0x0);
  return;
}

Assistant:

LUALIB_API void luaL_openlibs (lua_State *L) {
  const luaL_Reg *lib;
  /* "require" functions from 'loadedlibs' and set results to global table */
  for (lib = loadedlibs; lib->func; lib++) {
    luaL_requiref(L, lib->name, lib->func, 1);
    lua_pop(L, 1);  /* remove lib */
  }
}